

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpparser.c
# Opt level: O1

parse_status_t scanner_get_token(scanner_t *scanner,memptr *token,token_type_t *tok_type)

{
  byte *pbVar1;
  byte bVar2;
  ulong uVar3;
  ulong uVar4;
  char *pcVar5;
  bool bVar6;
  size_t sVar7;
  token_type_t tVar8;
  void *pvVar9;
  long lVar10;
  size_t sVar11;
  byte *pbVar12;
  byte *pbVar13;
  byte *pbVar14;
  byte *pbVar15;
  int iVar16;
  
  if (scanner == (scanner_t *)0x0) {
    __assert_fail("scanner",".upnp/src/genlib/net/http/httpparser.c",0xe1,
                  "parse_status_t scanner_get_token(scanner_t *, memptr *, token_type_t *)");
  }
  if (token == (memptr *)0x0) {
    __assert_fail("token",".upnp/src/genlib/net/http/httpparser.c",0xe2,
                  "parse_status_t scanner_get_token(scanner_t *, memptr *, token_type_t *)");
  }
  if (tok_type == (token_type_t *)0x0) {
    __assert_fail("tok_type",".upnp/src/genlib/net/http/httpparser.c",0xe3,
                  "parse_status_t scanner_get_token(scanner_t *, memptr *, token_type_t *)");
  }
  uVar3 = scanner->cursor;
  uVar4 = scanner->msg->length;
  if (uVar4 == uVar3) {
    return PARSE_INCOMPLETE;
  }
  pcVar5 = scanner->msg->buf;
  pbVar1 = (byte *)(pcVar5 + uVar3);
  pbVar13 = (byte *)(pcVar5 + uVar4);
  bVar2 = *pbVar1;
  iVar16 = (int)(char)bVar2;
  if ((iVar16 - 0x20U < 0x5f) &&
     (pvVar9 = memchr(" \t()<>@,;:\\\"/[]?={}",iVar16,0x14), pvVar9 == (void *)0x0)) {
    token->buf = (char *)pbVar1;
    sVar7 = 1;
    do {
      sVar11 = sVar7;
      if ((pbVar13 <= pbVar1 + sVar11) ||
         (iVar16 = (int)(char)pbVar1[sVar11], 0x5e < iVar16 - 0x20U)) break;
      pvVar9 = memchr(" \t()<>@,;:\\\"/[]?={}",iVar16,0x14);
      sVar7 = sVar11 + 1;
    } while (pvVar9 == (void *)0x0);
    if ((scanner->entire_msg_loaded == 0) && (uVar4 - uVar3 == sVar11)) {
      return PARSE_INCOMPLETE;
    }
    token->length = sVar11;
    tVar8 = TT_IDENTIFIER;
    goto LAB_0010c3a8;
  }
  if (bVar2 < 0xd) {
    if (bVar2 == 9) {
LAB_0010c18e:
      token->buf = (char *)pbVar1;
      pbVar14 = pbVar1 + 1;
      pbVar15 = pbVar14;
      if (pbVar14 < pbVar13) {
        lVar10 = ~uVar3 + uVar4;
        do {
          if ((*pbVar14 != 0x20) && (pbVar15 = pbVar14, *pbVar14 != 9)) break;
          pbVar14 = pbVar14 + 1;
          lVar10 = lVar10 + -1;
          pbVar15 = pbVar13;
        } while (lVar10 != 0);
      }
      if ((scanner->entire_msg_loaded == 0) && (pbVar15 == pbVar13)) {
        return PARSE_INCOMPLETE;
      }
      token->length = (long)pbVar15 - (long)pbVar1;
      tVar8 = TT_WHITESPACE;
      goto LAB_0010c3a8;
    }
    if (bVar2 != 10) {
LAB_0010c2f3:
      pvVar9 = memchr(" \t()<>@,;:\\\"/[]?={}",iVar16,0x14);
      if (pvVar9 == (void *)0x0) {
        tVar8 = TT_CTRL;
        if (0x1f < bVar2 && bVar2 != 0x7f) {
          return PARSE_FAILURE;
        }
        token->buf = (char *)pbVar1;
        token->length = 1;
      }
      else {
        token->buf = (char *)pbVar1;
        token->length = 1;
        tVar8 = TT_SEPARATOR;
      }
      goto LAB_0010c3a8;
    }
    token->buf = (char *)pbVar1;
    token->length = 1;
  }
  else {
    if (bVar2 != 0xd) {
      if (bVar2 == 0x22) {
        token->buf = (char *)pbVar1;
        pbVar14 = pbVar1 + 1;
        while (bVar6 = pbVar14 < pbVar13, bVar6) {
          pbVar15 = pbVar14 + 1;
          bVar2 = *pbVar14;
          if (bVar2 == 0x5c) {
            pbVar12 = pbVar14 + 2;
            pbVar14 = pbVar15;
            if (pbVar15 < pbVar13) {
              pbVar14 = pbVar12;
            }
          }
          else {
            pbVar14 = pbVar15;
            if (bVar2 == 0x22) break;
            if (((((int)(char)bVar2 - 0xbU < 0xfffffffe) && (bVar2 != 0xd)) && (-1 < (char)bVar2))
               && ((byte)(bVar2 + 0x81) < 0xa1)) {
              return PARSE_FAILURE;
            }
          }
        }
        if (!bVar6) {
          if (pbVar14 == pbVar13) {
            return PARSE_INCOMPLETE;
          }
          __assert_fail("cursor == null_terminator",".upnp/src/genlib/net/http/httpparser.c",0x131,
                        "parse_status_t scanner_get_token(scanner_t *, memptr *, token_type_t *)");
        }
        token->length = (long)pbVar14 - (long)pbVar1;
        tVar8 = TT_QUOTEDSTRING;
        goto LAB_0010c3a8;
      }
      if (bVar2 != 0x20) goto LAB_0010c2f3;
      goto LAB_0010c18e;
    }
    token->buf = (char *)pbVar1;
    if (pbVar1 + 1 == pbVar13) {
      return PARSE_INCOMPLETE;
    }
    if (pbVar1[1] != 10) {
      token->length = 1;
      tVar8 = TT_CTRL;
      goto LAB_0010c3a8;
    }
    token->length = 2;
  }
  tVar8 = TT_CRLF;
LAB_0010c3a8:
  scanner->cursor = uVar3 + token->length;
  *tok_type = tVar8;
  return PARSE_OK;
}

Assistant:

static parse_status_t scanner_get_token(
	scanner_t *scanner, memptr *token, token_type_t *tok_type)
{
	char *cursor;
	char *null_terminator; /* point to null-terminator in buffer */
	int c;
	token_type_t token_type;
	int got_end_quote;

	assert(scanner);
	assert(token);
	assert(tok_type);

	/* point to next char in buffer */
	cursor = scanner->msg->buf + scanner->cursor;
	null_terminator = scanner->msg->buf + scanner->msg->length;
	/* not enough chars in input to parse */
	if (cursor == null_terminator)
		return PARSE_INCOMPLETE;
	c = *cursor;
	if (is_identifier_char(c)) {
		/* scan identifier */
		token->buf = cursor++;
		token_type = TT_IDENTIFIER;
		while (cursor < null_terminator && is_identifier_char(*cursor))
			cursor++;
		if (!scanner->entire_msg_loaded && cursor == null_terminator)
			/* possibly more valid chars */
			return PARSE_INCOMPLETE;
		/* calc token length */
		token->length = (size_t)cursor - (size_t)token->buf;
	} else if (c == ' ' || c == '\t') {
		token->buf = cursor++;
		token_type = TT_WHITESPACE;
		while (cursor < null_terminator &&
			(*cursor == ' ' || *cursor == '\t'))
			cursor++;
		if (!scanner->entire_msg_loaded && cursor == null_terminator)
			/* possibly more chars */
			return PARSE_INCOMPLETE;
		token->length = (size_t)cursor - (size_t)token->buf;
	} else if (c == TOKCHAR_CR) {
		/* scan CRLF */
		token->buf = cursor++;
		if (cursor == null_terminator)
			/* not enuf info to determine CRLF */
			return PARSE_INCOMPLETE;
		if (*cursor != TOKCHAR_LF) {
			/* couldn't match CRLF; match as CR */
			token_type = TT_CTRL; /* ctrl char */
			token->length = (size_t)1;
		} else {
			/* got CRLF */
			token->length = (size_t)2;
			token_type = TT_CRLF;
			cursor++;
		}
	} else if (c == TOKCHAR_LF) { /* accept \n as CRLF */
		token->buf = cursor++;
		token->length = (size_t)1;
		token_type = TT_CRLF;
	} else if (c == '"') {
		/* quoted text */
		token->buf = cursor++;
		token_type = TT_QUOTEDSTRING;
		got_end_quote = 0;
		while (cursor < null_terminator) {
			c = *cursor++;
			if (c == '"') {
				got_end_quote = 1;
				break;
			} else if (c == '\\') {
				if (cursor < null_terminator) {
					/* c = *cursor++; */
					cursor++;
					/* the char after '\\' could be ANY
					 * octet */
				}
				/* else, while loop handles incomplete buf */
			} else if (is_qdtext_char(c)) {
				/* just accept char */
			} else
				/* bad quoted text */
				return PARSE_FAILURE;
		}
		if (got_end_quote)
			token->length = (size_t)cursor - (size_t)token->buf;
		else { /* incomplete */

			assert(cursor == null_terminator);
			return PARSE_INCOMPLETE;
		}
	} else if (is_separator_char(c)) {
		/* scan separator */
		token->buf = cursor++;
		token_type = TT_SEPARATOR;
		token->length = (size_t)1;
	} else if (is_control_char(c)) {
		/* scan ctrl char */
		token->buf = cursor++;
		token_type = TT_CTRL;
		token->length = (size_t)1;
	} else
		return PARSE_FAILURE;

	scanner->cursor += token->length; /* move to next token */
	*tok_type = token_type;
	return PARSE_OK;
}